

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_config.c
# Opt level: O0

int build_json(ps_config_t *config,char *json,int len)

{
  long *plVar1;
  int iVar2;
  char *pcVar3;
  cmd_ln_val_t *cval;
  char *key;
  int rv;
  int l;
  char *ptr;
  hash_iter_t *itor;
  int len_local;
  char *json_local;
  ps_config_t *config_local;
  
  key._0_4_ = snprintf(json,(long)len,"{\n");
  if ((int)key < 0) {
    config_local._4_4_ = -1;
  }
  else {
    _rv = json;
    itor._4_4_ = len;
    if (json != (char *)0x0) {
      itor._4_4_ = len - (int)key;
      _rv = json + (int)key;
    }
    for (ptr = (char *)hash_table_iter(config->ht); ptr != (char *)0x0;
        ptr = (char *)hash_table_iter_next((hash_iter_t *)ptr)) {
      pcVar3 = (char *)**(undefined8 **)(ptr + 8);
      plVar1 = *(long **)(*(long *)(ptr + 8) + 0x10);
      if (((*(uint *)(plVar1 + 1) & 8) == 0) || (*plVar1 != 0)) {
        key._4_4_ = serialize_key(_rv,itor._4_4_,pcVar3);
        if (key._4_4_ < 0) {
          return -1;
        }
        iVar2 = key._4_4_ + (int)key;
        if (_rv != (char *)0x0) {
          itor._4_4_ = itor._4_4_ - key._4_4_;
          _rv = _rv + key._4_4_;
        }
        if ((*(uint *)(plVar1 + 1) & 8) == 0) {
          if ((*(uint *)(plVar1 + 1) & 2) == 0) {
            if ((*(uint *)(plVar1 + 1) & 0x10) == 0) {
              if ((*(uint *)(plVar1 + 1) & 4) == 0) {
                err_msg(ERR_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_config.c"
                        ,0x1f5,"Unknown type %d for parameter %s\n",(ulong)*(uint *)(plVar1 + 1),
                        pcVar3);
              }
              else {
                key._4_4_ = snprintf(_rv,(long)itor._4_4_,"%g,\n",*plVar1);
                if (key._4_4_ < 0) {
                  return -1;
                }
              }
            }
            else {
              pcVar3 = "false";
              if (*plVar1 != 0) {
                pcVar3 = "true";
              }
              key._4_4_ = snprintf(_rv,(long)itor._4_4_,"%s,\n",pcVar3);
              if (key._4_4_ < 0) {
                return -1;
              }
            }
          }
          else {
            key._4_4_ = snprintf(_rv,(long)itor._4_4_,"%ld,\n",*plVar1);
            if (key._4_4_ < 0) {
              return -1;
            }
          }
        }
        else {
          key._4_4_ = serialize_value(_rv,itor._4_4_,(char *)*plVar1);
          if (key._4_4_ < 0) {
            return -1;
          }
        }
        key._0_4_ = key._4_4_ + iVar2;
        if (_rv != (char *)0x0) {
          itor._4_4_ = itor._4_4_ - key._4_4_;
          _rv = _rv + key._4_4_;
        }
      }
    }
    if ((_rv != (char *)0x0) && (json + 1 < _rv)) {
      itor._4_4_ = itor._4_4_ + 2;
      _rv = _rv + -2;
    }
    iVar2 = snprintf(_rv,(long)itor._4_4_,"\n}\n");
    if (iVar2 < 0) {
      config_local._4_4_ = -1;
    }
    else {
      config_local._4_4_ = iVar2 + (int)key;
    }
  }
  return config_local._4_4_;
}

Assistant:

static int
build_json(ps_config_t *config, char *json, int len)
{
    hash_iter_t *itor;
    char *ptr = json;
    int l, rv = 0;

    if ((l = snprintf(ptr, len, "{\n")) < 0)
        return -1;
    rv += l;
    if (ptr) {
        len -= l;
        ptr += l;
    }
    for (itor = hash_table_iter(config->ht); itor;
         itor = hash_table_iter_next(itor)) {
        const char *key = hash_entry_key(itor->ent);
        cmd_ln_val_t *cval = hash_entry_val(itor->ent);
        if (cval->type & ARG_STRING && cval->val.ptr == NULL)
            continue;
        if ((l = serialize_key(ptr, len, key)) < 0)
            return -1;
        rv += l;
        if (ptr) {
            len -= l;
            ptr += l;
        }
        if (cval->type & ARG_STRING) {
            if ((l = serialize_value(ptr, len,
                                     (char *)cval->val.ptr)) < 0)
                return -1;
        }
        else if (cval->type & ARG_INTEGER) {
            if ((l = snprintf(ptr, len, "%ld,\n",
                              cval->val.i)) < 0)
                return -1;
        }
        else if (cval->type & ARG_BOOLEAN) {
            if ((l = snprintf(ptr, len, "%s,\n",
                              cval->val.i ? "true" : "false")) < 0)
                return -1;
        }
        else if (cval->type & ARG_FLOATING) {
            if ((l = snprintf(ptr, len, "%g,\n",
                              cval->val.fl)) < 0)
                return -1;
        }
        else {
            E_ERROR("Unknown type %d for parameter %s\n",
                    cval->type, key);
        }
        rv += l;
        if (ptr) {
            len -= l;
            ptr += l;
        }
    }
    /* Back off last comma because JSON is awful */
    if (ptr && ptr > json + 1) {
        len += 2;
        ptr -= 2;
    }
    if ((l = snprintf(ptr, len, "\n}\n")) < 0)
        return -1;
    rv += l;
    if (ptr) {
        len -= l;
        ptr += l;
    }
    return rv;
}